

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void PacketSend(void)

{
  ulong local_18;
  uLong size;
  int c;
  
  if (14000 < doomcom.datalength) {
    I_FatalError("Netbuffer overflow!");
  }
  if ((doomcom.data[0] & 4) == 0) {
    local_18 = 7999;
    if (doomcom.datalength < 10) {
      size._4_4_ = 0xffffffff;
    }
    else {
      TransmitBuffer[0] = doomcom.data[0] | 4;
      size._4_4_ = compress2(TransmitBuffer + 1,&local_18,0xd54f75,(long)(doomcom.datalength + -1),9
                            );
      local_18 = local_18 + 1;
    }
    if ((size._4_4_ == 0) && (local_18 < (ulong)(long)doomcom.datalength)) {
      sendto(mysocket,TransmitBuffer,local_18,0,(sockaddr *)(sendaddress + doomcom.remotenode),0x10)
      ;
    }
    else if (doomcom.datalength < 0x1f41) {
      sendto(mysocket,doomcom.data,(long)doomcom.datalength,0,
             (sockaddr *)(sendaddress + doomcom.remotenode),0x10);
    }
    else {
      I_Error("Net compression failed (zlib error %d)",(ulong)size._4_4_);
    }
    return;
  }
  __assert_fail("!(doomcom.data[0] & NCMD_COMPRESSED)",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/i_net.cpp"
                ,0xd4,"void PacketSend()");
}

Assistant:

void PacketSend (void)
{
	int c;

	// FIXME: Catch this before we've overflown the buffer. With long chat
	// text and lots of backup tics, it could conceivably happen. (Though
	// apparently it hasn't yet, which is good.)
	if (doomcom.datalength > MAX_MSGLEN)
	{
		I_FatalError("Netbuffer overflow!");
	}
	assert(!(doomcom.data[0] & NCMD_COMPRESSED));

	uLong size = TRANSMIT_SIZE - 1;
	if (doomcom.datalength >= 10)
	{
		TransmitBuffer[0] = doomcom.data[0] | NCMD_COMPRESSED;
		c = compress2(TransmitBuffer + 1, &size, doomcom.data + 1, doomcom.datalength - 1, 9);
		size += 1;
	}
	else
	{
		c = -1;	// Just some random error code to avoid sending the compressed buffer.
	}
	if (c == Z_OK && size < (uLong)doomcom.datalength)
	{
//		Printf("send %lu/%d\n", size, doomcom.datalength);
		c = sendto(mysocket, (char *)TransmitBuffer, size,
			0, (sockaddr *)&sendaddress[doomcom.remotenode],
			sizeof(sendaddress[doomcom.remotenode]));
	}
	else
	{
		if (doomcom.datalength > TRANSMIT_SIZE)
		{
			I_Error("Net compression failed (zlib error %d)", c);
		}
		else
		{
//			Printf("send %d\n", doomcom.datalength);
			c = sendto(mysocket, (char *)doomcom.data, doomcom.datalength,
				0, (sockaddr *)&sendaddress[doomcom.remotenode],
				sizeof(sendaddress[doomcom.remotenode]));
		}
	}
	//	if (c == -1)
	//			I_Error ("SendPacket error: %s",strerror(errno));
}